

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.c
# Opt level: O2

_Bool Curl_pipeline_server_blacklisted(Curl_easy *handle,char *server_name)

{
  curl_llist_element *pcVar1;
  _Bool _Var2;
  int iVar3;
  curl_llist *pcVar4;
  size_t max;
  
  if (server_name == (char *)0x0 || handle->multi == (Curl_multi *)0x0) {
LAB_0013867f:
    _Var2 = false;
  }
  else {
    pcVar4 = Curl_multi_pipelining_server_bl(handle->multi);
    do {
      pcVar1 = pcVar4->head;
      if (pcVar1 == (curl_llist_element *)0x0) goto LAB_0013867f;
      max = strlen((char *)(pcVar1 + 1));
      iVar3 = Curl_strncasecompare((char *)(pcVar1 + 1),server_name,max);
      pcVar4 = (curl_llist *)&pcVar1->next;
    } while (iVar3 == 0);
    Curl_infof(handle,"Server %s is blacklisted\n",server_name);
    _Var2 = true;
  }
  return _Var2;
}

Assistant:

bool Curl_pipeline_server_blacklisted(struct Curl_easy *handle,
                                      char *server_name)
{
  if(handle->multi && server_name) {
    struct curl_llist *list =
      Curl_multi_pipelining_server_bl(handle->multi);

    struct curl_llist_element *e = list->head;
    while(e) {
      struct blacklist_node *bl = (struct blacklist_node *)e;
      if(strncasecompare(bl->server_name, server_name,
                         strlen(bl->server_name))) {
        infof(handle, "Server %s is blacklisted\n", server_name);
        return TRUE;
      }
      e = e->next;
    }

    DEBUGF(infof(handle, "Server %s is not blacklisted\n", server_name));
  }
  return FALSE;
}